

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

void google::protobuf::internal::WireFormat::SerializeFieldWithCachedSizes
               (FieldDescriptor *field,Message *message,CodedOutputStream *output)

{
  char cVar1;
  byte bVar2;
  undefined1 value;
  int iVar3;
  uint uVar4;
  uint32 uVar5;
  float value_00;
  undefined4 extraout_var;
  string *psVar7;
  double value_01;
  long lVar8;
  MessageLite *pMVar9;
  ulong value_02;
  uint uVar10;
  anon_union_8_2_947300a4 anon_var_0;
  string scratch;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  long *plVar6;
  
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  plVar6 = (long *)CONCAT44(extraout_var,iVar3);
  if ((((field[0x34] == (FieldDescriptor)0x1) &&
       (*(char *)(*(long *)(*(long *)(field + 0x38) + 0x20) + 0x58) == '\x01')) &&
      (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) == 10)) &&
     (*(int *)(field + 0x30) != 3)) {
    SerializeMessageSetItemWithCachedSizes(field,message,output);
    return;
  }
  if (*(int *)(field + 0x30) == 3) {
    uVar4 = (**(code **)(*plVar6 + 0x30))();
  }
  else {
    bVar2 = (**(code **)(*plVar6 + 0x28))(plVar6,message,field);
    uVar4 = (uint)bVar2;
  }
  cVar1 = *(char *)(*(long *)(field + 0x60) + 0x44);
  if (0 < (int)uVar4 && cVar1 == '\x01') {
    io::CodedOutputStream::WriteVarint32(output,*(int *)(field + 0x28) * 8 + 2);
    uVar5 = FieldDataOnlyByteSize(field,message);
    io::CodedOutputStream::WriteVarint32(output,uVar5);
  }
  if (0 < (int)uVar4) {
    uVar10 = 0;
    do {
      switch(*(undefined4 *)(field + 0x2c)) {
      case 1:
        if (*(int *)(field + 0x30) == 3) {
          value_01 = (double)(**(code **)(*plVar6 + 0x140))();
        }
        else {
          value_01 = (double)(**(code **)(*plVar6 + 0x90))(plVar6,message,field);
        }
        if (cVar1 == '\0') {
          WireFormatLite::WriteDouble(*(int *)(field + 0x28),value_01,output);
        }
        else {
LAB_001bbbd8:
          io::CodedOutputStream::WriteLittleEndian64(output,(uint64)value_01);
        }
        break;
      case 2:
        if (*(int *)(field + 0x30) == 3) {
          value_00 = (float)(**(code **)(*plVar6 + 0x138))();
        }
        else {
          value_00 = (float)(**(code **)(*plVar6 + 0x88))(plVar6,message,field);
        }
        if (cVar1 == '\0') {
          WireFormatLite::WriteFloat(*(int *)(field + 0x28),value_00,output);
        }
        else {
LAB_001bbc48:
          io::CodedOutputStream::WriteLittleEndian32(output,(uint32)value_00);
        }
        break;
      case 3:
        if (*(int *)(field + 0x30) == 3) {
          value_02 = (**(code **)(*plVar6 + 0x120))();
        }
        else {
          value_02 = (**(code **)(*plVar6 + 0x70))(plVar6,message,field);
        }
        if (cVar1 == '\0') {
          WireFormatLite::WriteInt64(*(int *)(field + 0x28),value_02,output);
        }
        else {
LAB_001bbba3:
          io::CodedOutputStream::WriteVarint64(output,value_02);
        }
        break;
      case 4:
        if (*(int *)(field + 0x30) == 3) {
          value_02 = (**(code **)(*plVar6 + 0x130))();
        }
        else {
          value_02 = (**(code **)(*plVar6 + 0x80))(plVar6,message,field);
        }
        if (cVar1 != '\0') goto LAB_001bbba3;
        WireFormatLite::WriteUInt64(*(int *)(field + 0x28),value_02,output);
        break;
      case 5:
        if (*(int *)(field + 0x30) == 3) {
          uVar5 = (**(code **)(*plVar6 + 0x118))();
        }
        else {
          uVar5 = (**(code **)(*plVar6 + 0x68))(plVar6,message,field);
        }
        if (cVar1 != '\0') {
          if (-1 < (int)uVar5) goto LAB_001bbc17;
          value_02 = (ulong)(int)uVar5;
          goto LAB_001bbba3;
        }
        WireFormatLite::WriteInt32(*(int *)(field + 0x28),uVar5,output);
        break;
      case 6:
        if (*(int *)(field + 0x30) == 3) {
          value_01 = (double)(**(code **)(*plVar6 + 0x130))();
        }
        else {
          value_01 = (double)(**(code **)(*plVar6 + 0x80))(plVar6,message,field);
        }
        if (cVar1 != '\0') goto LAB_001bbbd8;
        WireFormatLite::WriteFixed64(*(int *)(field + 0x28),(uint64)value_01,output);
        break;
      case 7:
        if (*(int *)(field + 0x30) == 3) {
          value_00 = (float)(**(code **)(*plVar6 + 0x128))();
        }
        else {
          value_00 = (float)(**(code **)(*plVar6 + 0x78))(plVar6,message,field);
        }
        if (cVar1 != '\0') goto LAB_001bbc48;
        WireFormatLite::WriteFixed32(*(int *)(field + 0x28),(uint32)value_00,output);
        break;
      case 8:
        if (*(int *)(field + 0x30) == 3) {
          value = (**(code **)(*plVar6 + 0x148))();
        }
        else {
          value = (**(code **)(*plVar6 + 0x98))(plVar6,message,field);
        }
        uVar5 = (uint32)(byte)value;
        if (cVar1 == '\0') {
          WireFormatLite::WriteBool(*(int *)(field + 0x28),(bool)value,output);
        }
        else {
LAB_001bbc17:
          io::CodedOutputStream::WriteVarint32(output,uVar5);
        }
        break;
      case 9:
        local_50 = &local_40;
        local_48 = 0;
        local_40 = 0;
        if (*(int *)(field + 0x30) == 3) {
          psVar7 = (string *)(**(code **)(*plVar6 + 0x168))(plVar6,message,field,uVar10,&local_50);
        }
        else {
          psVar7 = (string *)(**(code **)(*plVar6 + 0xb8))(plVar6,message,field,&local_50);
        }
        VerifyUTF8StringFallback((psVar7->_M_dataplus)._M_p,(int)psVar7->_M_string_length,SERIALIZE)
        ;
        WireFormatLite::WriteString(*(int *)(field + 0x28),psVar7,output);
        goto LAB_001bbcb2;
      case 10:
        iVar3 = *(int *)(field + 0x28);
        if (*(int *)(field + 0x30) == 3) {
          pMVar9 = (MessageLite *)(**(code **)(*plVar6 + 0x160))();
        }
        else {
          pMVar9 = (MessageLite *)(**(code **)(*plVar6 + 0xb0))(plVar6,message,field,0);
        }
        WireFormatLite::WriteGroup(iVar3,pMVar9,output);
        break;
      case 0xb:
        iVar3 = *(int *)(field + 0x28);
        if (*(int *)(field + 0x30) == 3) {
          pMVar9 = (MessageLite *)(**(code **)(*plVar6 + 0x160))();
        }
        else {
          pMVar9 = (MessageLite *)(**(code **)(*plVar6 + 0xb0))(plVar6,message,field,0);
        }
        WireFormatLite::WriteMessage(iVar3,pMVar9,output);
        break;
      case 0xc:
        local_50 = &local_40;
        local_48 = 0;
        local_40 = 0;
        if (*(int *)(field + 0x30) == 3) {
          psVar7 = (string *)(**(code **)(*plVar6 + 0x168))(plVar6,message,field,uVar10,&local_50);
        }
        else {
          psVar7 = (string *)(**(code **)(*plVar6 + 0xb8))(plVar6,message,field,&local_50);
        }
        WireFormatLite::WriteBytes(*(int *)(field + 0x28),psVar7,output);
LAB_001bbcb2:
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
        break;
      case 0xd:
        if (*(int *)(field + 0x30) == 3) {
          uVar5 = (**(code **)(*plVar6 + 0x128))();
        }
        else {
          uVar5 = (**(code **)(*plVar6 + 0x78))(plVar6,message,field);
        }
        if (cVar1 != '\0') goto LAB_001bbc17;
        WireFormatLite::WriteUInt32(*(int *)(field + 0x28),uVar5,output);
        break;
      case 0xe:
        if (*(int *)(field + 0x30) == 3) {
          lVar8 = (**(code **)(*plVar6 + 0x158))();
        }
        else {
          lVar8 = (**(code **)(*plVar6 + 0xa8))(plVar6,message,field);
        }
        if (cVar1 != '\0') {
          uVar5 = *(uint32 *)(lVar8 + 0x10);
          value_02 = (ulong)(int)uVar5;
          if (-1 < (long)value_02) goto LAB_001bbc17;
          goto LAB_001bbba3;
        }
        WireFormatLite::WriteEnum(*(int *)(field + 0x28),*(int *)(lVar8 + 0x10),output);
        break;
      case 0xf:
        if (*(int *)(field + 0x30) == 3) {
          value_00 = (float)(**(code **)(*plVar6 + 0x118))();
        }
        else {
          value_00 = (float)(**(code **)(*plVar6 + 0x68))(plVar6,message,field);
        }
        if (cVar1 != '\0') goto LAB_001bbc48;
        WireFormatLite::WriteSFixed32(*(int *)(field + 0x28),(int32)value_00,output);
        break;
      case 0x10:
        if (*(int *)(field + 0x30) == 3) {
          value_01 = (double)(**(code **)(*plVar6 + 0x120))();
        }
        else {
          value_01 = (double)(**(code **)(*plVar6 + 0x70))(plVar6,message,field);
        }
        if (cVar1 != '\0') goto LAB_001bbbd8;
        WireFormatLite::WriteSFixed64(*(int *)(field + 0x28),(int64)value_01,output);
        break;
      case 0x11:
        if (*(int *)(field + 0x30) == 3) {
          iVar3 = (**(code **)(*plVar6 + 0x118))();
        }
        else {
          iVar3 = (**(code **)(*plVar6 + 0x68))(plVar6,message,field);
        }
        if (cVar1 != '\0') {
          uVar5 = iVar3 >> 0x1f ^ iVar3 * 2;
          goto LAB_001bbc17;
        }
        WireFormatLite::WriteSInt32(*(int *)(field + 0x28),iVar3,output);
        break;
      case 0x12:
        if (*(int *)(field + 0x30) == 3) {
          lVar8 = (**(code **)(*plVar6 + 0x120))();
        }
        else {
          lVar8 = (**(code **)(*plVar6 + 0x70))(plVar6,message,field);
        }
        if (cVar1 != '\0') {
          value_02 = lVar8 >> 0x3f ^ lVar8 * 2;
          goto LAB_001bbba3;
        }
        WireFormatLite::WriteSInt64(*(int *)(field + 0x28),lVar8,output);
      }
      uVar10 = uVar10 + 1;
    } while (uVar4 != uVar10);
  }
  return;
}

Assistant:

void WireFormat::SerializeFieldWithCachedSizes(
    const FieldDescriptor* field,
    const Message& message,
    io::CodedOutputStream* output) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    SerializeMessageSetItemWithCachedSizes(field, message, output);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  const bool is_packed = field->options().packed();
  if (is_packed && count > 0) {
    WireFormatLite::WriteTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    const int data_size = FieldDataOnlyByteSize(field, message);
    output->WriteVarint32(data_size);
  }

  for (int j = 0; j < count; j++) {
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
      case FieldDescriptor::TYPE_##TYPE: {                                     \
        const CPPTYPE value = field->is_repeated() ?                           \
                              message_reflection->GetRepeated##CPPTYPE_METHOD( \
                                message, field, j) :                           \
                              message_reflection->Get##CPPTYPE_METHOD(         \
                                message, field);                               \
        if (is_packed) {                                                       \
          WireFormatLite::Write##TYPE_METHOD##NoTag(value, output);            \
        } else {                                                               \
          WireFormatLite::Write##TYPE_METHOD(field->number(), value, output);  \
        }                                                                      \
        break;                                                                 \
      }

      HANDLE_PRIMITIVE_TYPE( INT32,  int32,  Int32,  Int32)
      HANDLE_PRIMITIVE_TYPE( INT64,  int64,  Int64,  Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32,  int32, SInt32,  Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64,  int64, SInt64,  Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE( FIXED32, uint32,  Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE( FIXED64, uint64,  Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32,  int32, SFixed32,  Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64,  int64, SFixed64,  Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT , float , Float , Float )
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                       \
      case FieldDescriptor::TYPE_##TYPE:                                     \
        WireFormatLite::Write##TYPE_METHOD(                                  \
              field->number(),                                               \
              field->is_repeated() ?                                         \
                message_reflection->GetRepeated##CPPTYPE_METHOD(             \
                  message, field, j) :                                       \
                message_reflection->Get##CPPTYPE_METHOD(message, field),     \
              output);                                                       \
        break;

      HANDLE_TYPE(GROUP  , Group  , Message)
      HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value = field->is_repeated() ?
          message_reflection->GetRepeatedEnum(message, field, j) :
          message_reflection->GetEnum(message, field);
        if (is_packed) {
          WireFormatLite::WriteEnumNoTag(value->number(), output);
        } else {
          WireFormatLite::WriteEnum(field->number(), value->number(), output);
        }
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        VerifyUTF8String(value.data(), value.length(), SERIALIZE);
        WireFormatLite::WriteString(field->number(), value, output);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        WireFormatLite::WriteBytes(field->number(), value, output);
        break;
      }
    }
  }
}